

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::setTex2DArrayBinding
          (ReferenceContext *this,int unitNdx,Texture2DArray *texture)

{
  reference pvVar1;
  Texture2DArray *texture_local;
  int unitNdx_local;
  ReferenceContext *this_local;
  
  pvVar1 = std::
           vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ::operator[](&this->m_textureUnits,(long)unitNdx);
  if (pvVar1->tex2DArrayBinding != (Texture2DArray *)0x0) {
    pvVar1 = std::
             vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
             ::operator[](&this->m_textureUnits,(long)unitNdx);
    rc::ObjectManager<sglr::rc::Texture>::releaseReference
              (&this->m_textures,&pvVar1->tex2DArrayBinding->super_Texture);
    pvVar1 = std::
             vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
             ::operator[](&this->m_textureUnits,(long)unitNdx);
    pvVar1->tex2DArrayBinding = (Texture2DArray *)0x0;
  }
  if (texture != (Texture2DArray *)0x0) {
    rc::ObjectManager<sglr::rc::Texture>::acquireReference
              (&this->m_textures,&texture->super_Texture);
    pvVar1 = std::
             vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
             ::operator[](&this->m_textureUnits,(long)unitNdx);
    pvVar1->tex2DArrayBinding = texture;
  }
  return;
}

Assistant:

void ReferenceContext::setTex2DArrayBinding (int unitNdx, Texture2DArray* texture)
{
	if (m_textureUnits[unitNdx].tex2DArrayBinding)
	{
		m_textures.releaseReference(m_textureUnits[unitNdx].tex2DArrayBinding);
		m_textureUnits[unitNdx].tex2DArrayBinding = DE_NULL;
	}

	if (texture)
	{
		m_textures.acquireReference(texture);
		m_textureUnits[unitNdx].tex2DArrayBinding = texture;
	}
}